

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

CharCount __thiscall
UnifiedRegex::AltNode::TransferPass0(AltNode *this,Compiler *compiler,Char *litbuf)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 rhs;
  ThreadContext *this_00;
  undefined4 *puVar4;
  AltNode *local_38;
  AltNode *curr;
  AltNode *prev;
  CharCount n;
  Char *litbuf_local;
  Compiler *compiler_local;
  AltNode *this_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (this->tail == (AltNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x855,"(tail != 0)","tail != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  prev._4_4_ = 0;
  curr = (AltNode *)0x0;
  local_38 = this;
  do {
    if (local_38 == (AltNode *)0x0) {
      return prev._4_4_;
    }
    if (local_38->head->tag == Alt) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x85c,"(curr->head->tag != Alt)","curr->head->tag != Alt");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (((curr != (AltNode *)0x0) && (uVar3 = (*curr->head->_vptr_Node[2])(), (uVar3 & 1) != 0)) &&
       (uVar3 = (*local_38->head->_vptr_Node[2])(), (uVar3 & 1) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x85d,
                         "(prev == 0 || !(prev->head->IsCharOrPositiveSet() && curr->head->IsCharOrPositiveSet()))"
                         ,
                         "prev == 0 || !(prev->head->IsCharOrPositiveSet() && curr->head->IsCharOrPositiveSet())"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    rhs = (*local_38->head->_vptr_Node[3])(local_38->head,compiler,litbuf);
    prev._4_4_ = UInt32Math::Add(prev._4_4_,rhs);
    curr = local_38;
    local_38 = local_38->tail;
  } while( true );
}

Assistant:

CharCount AltNode::TransferPass0(Compiler& compiler, const Char* litbuf)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(tail != 0);
        CharCount n = 0;
#if DBG
        AltNode* prev = 0;
#endif
        for (AltNode* curr = this; curr != 0; curr = curr->tail)
        {
            Assert(curr->head->tag != Alt);
            Assert(prev == 0 || !(prev->head->IsCharOrPositiveSet() && curr->head->IsCharOrPositiveSet()));
            n = UInt32Math::Add(n, curr->head->TransferPass0(compiler, litbuf));
#if DBG
            prev = curr;
#endif
        }
        return n;
    }